

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::CodeHolder::bindLabel
          (CodeHolder *this,Label *label,uint32_t toSectionId,uint64_t toOffset)

{
  long *plVar1;
  CodeBuffer *cb;
  int iVar2;
  uint uVar3;
  OffsetFormat OVar4;
  long lVar5;
  OffsetFormat OVar6;
  bool bVar7;
  undefined1 uVar8;
  Error EVar9;
  uint uVar10;
  undefined8 *puVar11;
  uint *puVar12;
  ExpressionValueType *pEVar13;
  Value VVar14;
  ulong uVar15;
  Value VVar16;
  uint extraout_EDX;
  long lVar17;
  ulong uVar18;
  ExpressionValueType *pEVar19;
  Section *pSVar20;
  bool bVar21;
  ulong uVar22;
  Value self;
  ZoneAllocator *allocator;
  CodeHolder *self_00;
  CodeHolder *pCVar23;
  long lVar24;
  CodeHolder *dst;
  OffsetFormat *unaff_R13;
  undefined8 *puVar25;
  Value *pVVar26;
  undefined8 *puVar27;
  Value aVStack_148 [2];
  Value VStack_138;
  Value VStack_130;
  Value VStack_128;
  Section *pSStack_120;
  CodeHolder *pCStack_118;
  OffsetFormat *pOStack_110;
  CodeHolder *pCStack_108;
  Value VStack_100;
  code *pcStack_f8;
  Arch AStack_e9;
  ulong uStack_e8;
  Section *pSStack_e0;
  Value VStack_d8;
  uint8_t *puStack_d0;
  Value VStack_c8;
  ulong uStack_c0;
  Label *pLStack_b8;
  CodeHolder *pCStack_b0;
  size_t sStack_78;
  uint64_t uStack_70;
  Error local_3c;
  
  uVar10 = (label->super_Operand).super_Operand_._baseId;
  if ((*(uint *)&this->field_0x100 <= uVar10) ||
     (lVar17 = *(long *)(*(long *)&this->_labelEntries + (ulong)uVar10 * 8), lVar17 == 0)) {
    return 0xc;
  }
  if (toSectionId <= *(uint *)&this->field_0xe0) {
    if (*(long *)(lVar17 + 0x20) != 0) {
      return 0xe;
    }
    if (*(uint *)&this->field_0xe0 <= toSectionId) {
      bindLabel();
      uVar22 = (ulong)extraout_EDX;
      allocator = &this->_allocator;
      uVar10 = *(uint *)&this->field_0x110;
      uStack_70 = toOffset;
      if (*(uint *)&this->field_0x114 == uVar10) {
        EVar9 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_relocations,allocator,8,1);
        if (EVar9 != 0) {
          return EVar9;
        }
        uVar10 = *(uint *)&this->field_0x110;
      }
      dst = (CodeHolder *)(ulong)uVar10;
      if (uVar10 == 0xffffffff) {
        EVar9 = 0x16;
      }
      else {
        if (*(long *)allocator == 0) {
          newRelocEntry();
        }
        else {
          puVar12 = (uint *)ZoneAllocator::_allocZeroed(allocator,0x28,&sStack_78);
          if (puVar12 != (uint *)0x0) {
            *puVar12 = uVar10;
            puVar12[1] = extraout_EDX;
            puVar12[4] = 0xffffffff;
            puVar12[5] = 0xffffffff;
            if (*(uint *)&this->field_0x110 < *(uint *)&this->field_0x114) {
              *(uint **)(*(long *)&this->_relocations + (ulong)*(uint *)&this->field_0x110 * 8) =
                   puVar12;
              *(int *)&this->field_0x110 = *(int *)&this->field_0x110 + 1;
              *(uint **)&(label->super_Operand).super_Operand_ = puVar12;
              return 0;
            }
            newRelocEntry();
            if ((ulong)*(uint *)(allocator + 0xf0) == 0) {
              uVar10 = 0;
            }
            else {
              lVar17 = 0;
              self_00 = (CodeHolder *)0x0;
              VVar16._0_1_ = kSignedOffset;
              VVar16._1_1_ = '\0';
              VVar16._2_1_ = '\0';
              VVar16._3_1_ = '\0';
              VVar16._4_1_ = '\0';
              VVar16._5_1_ = '\0';
              VVar16._6_1_ = '\0';
              VVar16._7_1_ = '\0';
              do {
                lVar24 = *(long *)(*(long *)(allocator + 0xe8) + lVar17);
                uVar18 = *(ulong *)(lVar24 + 0x50);
                if (*(ulong *)(lVar24 + 0x50) < *(ulong *)(lVar24 + 0x18)) {
                  uVar18 = *(ulong *)(lVar24 + 0x18);
                }
                if (uVar18 != 0) {
                  pCVar23 = (CodeHolder *)
                            (-(ulong)*(uint *)(lVar24 + 8) &
                            (long)self_00 + ((ulong)*(uint *)(lVar24 + 8) - 1));
                  if (pCVar23 < self_00) {
                    codeSize();
                    if ((OffsetFormat)VVar16.constant == (OffsetFormat)0xffffffffffffffff)
                    goto LAB_0011924f;
                    self_00->_baseAddress = (uint64_t)VVar16;
                    AStack_e9 = (self_00->_environment)._arch;
                    pSVar20 = self_00->_addressTableSection;
                    VVar14 = VVar16;
                    pCVar23 = self_00;
                    pLStack_b8 = label;
                    pCStack_b0 = dst;
                    if (pSVar20 == (Section *)0x0) {
                      puStack_d0 = (uint8_t *)0x0;
                    }
                    else {
                      cb = &pSVar20->_buffer;
                      if ((pSVar20->_buffer)._capacity < pSVar20->_virtualSize) {
                        uVar22 = 9;
                        if (((pSVar20->_buffer)._flags & kIsFixed) != kNone) goto LAB_00119229;
                        pcStack_f8 = (code *)0x118f4e;
                        VVar14 = (Value)cb;
                        EVar9 = CodeHolder_reserveInternal(self_00,cb,pSVar20->_virtualSize);
                        uVar22 = (ulong)EVar9;
                        if (EVar9 != 0) goto LAB_00119229;
                      }
                      puStack_d0 = cb->_data;
                      dst = (CodeHolder *)cb;
                    }
                    uStack_e8 = 0;
                    pSStack_e0 = pSVar20;
                    VStack_d8 = VVar16;
                    if ((ulong)*(uint *)&self_00->field_0x110 == 0) goto LAB_001191ea;
                    pSVar20 = (Section *)
                              ((*(Value *)&self_00->_relocations)->valueType +
                              (ulong)*(uint *)&self_00->field_0x110 * 8 + -1);
                    uStack_c0 = (ulong)(AStack_e9 & k32BitMask) ^ 3;
                    uStack_e8 = 0;
                    uVar22 = 0x17;
                    VVar16.expression = *(Value *)&self_00->_relocations;
                    goto LAB_00118fcd;
                  }
                  self_00 = (CodeHolder *)(&(pCVar23->_environment)._arch + uVar18);
                  VVar16._0_1_ = (OffsetType)VVar16.constant | CARRY8((ulong)pCVar23,uVar18);
                  VVar16.constant._1_7_ = 0;
                }
                lVar17 = lVar17 + 8;
              } while ((ulong)*(uint *)(allocator + 0xf0) << 3 != lVar17);
              uVar10 = -(uint)((OffsetType)VVar16.constant != kSignedOffset) | (uint)self_00;
            }
            return uVar10;
          }
        }
        EVar9 = 1;
      }
      return EVar9;
    }
    lVar24 = *(long *)(*(long *)&this->_sections + (ulong)toSectionId * 8);
    *(long *)(lVar17 + 0x20) = lVar24;
    *(uint64_t *)(lVar17 + 0x18) = toOffset;
    if (*(undefined8 **)(lVar17 + 0x28) == (undefined8 *)0x0) {
      return 0;
    }
    local_3c = 0;
    puVar11 = *(undefined8 **)(lVar17 + 0x28);
    puVar27 = (undefined8 *)(lVar17 + 0x28);
    while( true ) {
      puVar25 = puVar11;
      uVar10 = *(uint *)((long)puVar25 + 0xc);
      if ((ulong)uVar10 != 0xffffffff) break;
      if (*(uint32_t *)(puVar25 + 1) == toSectionId) {
        uVar22 = puVar25[2];
        if (*(ulong *)(lVar24 + 0x50) <= uVar22) goto LAB_00118d8c;
        if ((ulong)*(byte *)((long)puVar25 + 0x22) <= *(ulong *)(lVar24 + 0x50) - uVar22) {
          bVar7 = CodeWriterUtils::writeOffset
                            ((void *)(uVar22 + *(long *)(lVar24 + 0x48)),
                             (toOffset - uVar22) + puVar25[3],(OffsetFormat *)(puVar25 + 4));
          if (bVar7) goto LAB_00118cd8;
          puVar11 = (undefined8 *)*puVar25;
          local_3c = 0x30;
          goto LAB_00118d56;
        }
        goto LAB_00118d91;
      }
      puVar11 = (undefined8 *)*puVar25;
LAB_00118d56:
      puVar27 = puVar25;
      if (puVar11 == (undefined8 *)0x0) {
        return local_3c;
      }
    }
    if (uVar10 < *(uint *)&this->field_0x110) {
      lVar17 = *(long *)(*(long *)&this->_relocations + (ulong)uVar10 * 8);
      plVar1 = (long *)(lVar17 + 0x20);
      *plVar1 = *plVar1 + toOffset;
      *(uint32_t *)(lVar17 + 0x14) = toSectionId;
LAB_00118cd8:
      puVar11 = (undefined8 *)*puVar25;
      *puVar27 = puVar11;
      this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
      if (*(long *)&this->_allocator != 0) {
        *puVar25 = *(undefined8 *)&this->field_0x78;
        *(undefined8 **)&this->field_0x78 = puVar25;
        puVar25 = puVar27;
        goto LAB_00118d56;
      }
      bindLabel();
    }
    bindLabel();
LAB_00118d8c:
    bindLabel();
LAB_00118d91:
    bindLabel();
  }
  return 0x13;
LAB_00118fcd:
  do {
    unaff_R13 = *(OffsetFormat **)VVar16.expression;
    iVar2 = *(int *)&unaff_R13->_valueOffset;
    if (iVar2 != 0) {
      uVar10._0_1_ = unaff_R13[2]._type;
      uVar10._1_1_ = unaff_R13[2]._flags;
      uVar10._2_1_ = unaff_R13[2]._regionSize;
      uVar10._3_1_ = unaff_R13[2]._valueSize;
      if (*(uint *)&self_00->field_0xe0 <= uVar10) {
        pcStack_f8 = (code *)0x11924a;
        relocateToBase();
LAB_0011924a:
        pcStack_f8 = (code *)0x11924f;
        relocateToBase();
LAB_0011924f:
        uVar22 = 2;
        goto LAB_00119229;
      }
      lVar17 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar10 * 8);
      uVar3._0_1_ = unaff_R13[2]._valueOffset;
      uVar3._1_1_ = unaff_R13[2]._immBitCount;
      uVar3._2_1_ = unaff_R13[2]._immBitShift;
      uVar3._3_1_ = unaff_R13[2]._immDiscardLsb;
      if ((ulong)uVar3 == 0xffffffff) {
        lVar24 = 0;
      }
      else {
        if (*(uint *)&self_00->field_0xe0 <= uVar3) goto LAB_0011924a;
        lVar24 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar3 * 8);
      }
      self = (Value)((Value *)(unaff_R13 + 4))->expression;
      OVar4 = unaff_R13[3];
      if ((((ulong)*(OffsetFormat *)(lVar17 + 0x50) <= (ulong)OVar4) ||
          (pCVar23 = (CodeHolder *)(ulong)unaff_R13[1]._regionSize,
          (CodeHolder *)((long)*(OffsetFormat *)(lVar17 + 0x50) - (long)OVar4) < pCVar23)) ||
         (4 < iVar2 - 1U)) goto LAB_00119229;
      lVar5 = *(long *)(lVar17 + 0x10);
      dst = *(CodeHolder **)(lVar17 + 0x48);
      VVar14 = self;
      VStack_c8 = self;
      switch(iVar2) {
      case 1:
        pcStack_f8 = (code *)0x119072;
        EVar9 = CodeHolder_evaluateExpression
                          ((CodeHolder *)self.expression,(Expression *)&VStack_c8,
                           (uint64_t *)&switchD_00119063::switchdataD_0014c3c0);
        VVar14 = VStack_c8;
        if (EVar9 != 0) {
          uVar22 = (ulong)EVar9;
          goto LAB_00119229;
        }
        break;
      case 3:
        if (lVar24 == 0) goto LAB_00119229;
        VVar14.expression =
             (Expression *)
             ((self.expression)->valueType + (long)(VStack_d8.constant - 1) +
             *(long *)(lVar24 + 0x10));
        break;
      case 4:
        VVar14.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_d8.expression)->valueType + (long)pCVar23 + lVar5 + (long)OVar4 + -1));
        if ((AStack_e9 & k32BitMask) == kUnknown) {
          if ((long)(int)VVar14.constant != VVar14.constant) {
LAB_0011923e:
            uVar22 = 0x18;
            goto LAB_00119229;
          }
        }
        else {
          VVar14 = (Value)(long)(int)VVar14.constant;
        }
        break;
      case 5:
        if ((unaff_R13[1]._valueSize != '\x04') ||
           (uVar18 = (ulong)unaff_R13[1]._valueOffset + (long)OVar4, uVar18 < 2)) goto LAB_00119229;
        VVar14.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_d8.expression)->valueType + (long)pCVar23 + lVar5 + (long)OVar4 + -1));
        if ((long)(int)VVar14.constant != VVar14.constant) {
          uVar15 = *(ulong *)&self_00->_addressTableEntries;
          while( true ) {
            if (uVar15 == 0) goto LAB_00119229;
            OVar6 = *(OffsetFormat *)(uVar15 + 0x10);
            uVar10 = (uint)((ulong)OVar6 >= self.constant && OVar6 != (OffsetFormat)self.constant) -
                     (uint)((ulong)OVar6 < self.constant);
            if (uVar10 == 0) break;
            uVar15 = *(ulong *)(uVar15 + (ulong)(uVar10 >> 0x1f) * 8) & 0xfffffffffffffffe;
          }
          if (pSStack_e0 == (Section *)0x0) goto LAB_00119260;
          uVar10 = *(uint *)(uVar15 + 0x18);
          if (uVar10 == 0xffffffff) {
            uVar10 = (uint)uStack_e8;
            *(uint *)(uVar15 + 0x18) = uVar10;
            uStack_e8 = (ulong)(uVar10 + 1);
          }
          lVar17 = (ulong)uVar10 << ((byte)uStack_c0 & 0x3f);
          VVar14.expression =
               (Expression *)
               (pSStack_e0->_offset +
               (lVar17 - (long)(&(pCVar23->_environment)._arch + (long)OVar4 + lVar5)));
          if ((long)(int)VVar14.constant != VVar14.constant) goto LAB_0011923e;
          uVar8 = 0x15;
          if ((&dst[-1].field_0x157)[uVar18] != -0x18) {
            if ((&dst[-1].field_0x157)[uVar18] != -0x17) goto LAB_00119229;
            uVar8 = 0x25;
          }
          (&dst[-1].field_0x156)[uVar18] = 0xff;
          (&dst[-1].field_0x157)[uVar18] = uVar8;
          *(OffsetFormat *)(puStack_d0 + lVar17) = unaff_R13[4];
        }
      }
      dst = (CodeHolder *)(&(dst->_environment)._arch + (long)unaff_R13[3]);
      unaff_R13 = unaff_R13 + 1;
      pcStack_f8 = (code *)0x1191d9;
      pCVar23 = dst;
      bVar7 = CodeWriterUtils::writeOffset(dst,VVar14.constant,unaff_R13);
      if (!bVar7) goto LAB_00119229;
    }
    VVar16.expression = (Expression *)(VVar16.expression)->value;
  } while ((Section *)VVar16.constant != pSVar20);
LAB_001191ea:
  if (*(int *)&self_00->field_0xf0 == 0) {
    pcStack_f8 = (code *)0x11925b;
    relocateToBase();
    self = VVar14;
  }
  else {
    uVar22 = 0;
    if (*(Section **)
         (*(long *)&self_00->_sectionsByOrder + (ulong)(*(int *)&self_00->field_0xf0 - 1) * 8) !=
        pSStack_e0) {
LAB_00119229:
      return (Error)uVar22;
    }
    self = VVar14;
    if (pSStack_e0 != (Section *)0x0) {
      uVar18 = (ulong)(uint)((int)uStack_e8 << (AStack_e9 & k32BitMask ^ kRISCV32));
      (pSStack_e0->_buffer)._size = uVar18;
      pSStack_e0->_virtualSize = uVar18;
      goto LAB_00119229;
    }
  }
  pcStack_f8 = (code *)0x119260;
  relocateToBase();
LAB_00119260:
  pcStack_f8 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar17 = 0;
  pVVar26 = aVStack_148;
  bVar7 = true;
  VStack_138 = self;
  pSStack_120 = pSVar20;
  pCStack_118 = dst;
  pOStack_110 = unaff_R13;
  pCStack_108 = self_00;
  VStack_100 = VVar16;
  pcStack_f8 = (code *)uVar22;
  do {
    bVar21 = bVar7;
    VVar14.constant._1_7_ = 0;
    VVar14.constant._0_1_ = (&(pCVar23->_environment)._subArch)[lVar17];
    if (3 < VVar14.constant) {
      return 3;
    }
    switch(VVar14.constant) {
    case 1:
      VVar14 = *(Value *)(&pCVar23->_cpuFeatures + lVar17 * 8);
      break;
    case 2:
      lVar24 = *(long *)(*(long *)(&pCVar23->_cpuFeatures + lVar17 * 8) + 0x20);
      if (lVar24 == 0) {
        return 0x43;
      }
      VVar14.expression =
           (Expression *)
           (*(long *)(*(long *)(&pCVar23->_cpuFeatures + lVar17 * 8) + 0x18) +
           *(long *)(lVar24 + 0x10));
      break;
    case 3:
      EVar9 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&pCVar23->_cpuFeatures + lVar17 * 8),
                         (Expression *)&VStack_128,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[VVar14.constant]));
      VVar14 = VStack_128;
      if (EVar9 != 0) {
        return EVar9;
      }
    }
    pVVar26->constant = (uint64_t)VVar14;
    lVar17 = 1;
    pVVar26 = &VStack_130;
    bVar7 = false;
  } while (bVar21);
  switch((pCVar23->_environment)._arch) {
  case kUnknown:
    pEVar13 = (VStack_130.expression)->valueType + (aVStack_148[0].constant - 1);
    break;
  case k32BitMask:
    pEVar13 = (ExpressionValueType *)((long)aVStack_148[0].expression - (long)VStack_130);
    break;
  case kHost:
    pEVar13 = (ExpressionValueType *)(VStack_130.constant * aVStack_148[0].constant);
    break;
  case kRISCV32:
    pEVar19 = (ExpressionValueType *)(aVStack_148[0].constant << ((byte)VStack_130.constant & 0x3f))
    ;
    goto LAB_00119352;
  case kRISCV64:
    pEVar19 = (ExpressionValueType *)(aVStack_148[0].constant >> ((byte)VStack_130.constant & 0x3f))
    ;
LAB_00119352:
    pEVar13 = (ExpressionValueType *)0x0;
    if (VStack_130.constant < 0x40) {
      pEVar13 = pEVar19;
    }
    break;
  case kARM:
    VVar16.constant = 0x3f;
    if (VStack_130.constant < 0x3f) {
      VVar16 = VStack_130;
    }
    pEVar13 = (ExpressionValueType *)
              ((long)aVStack_148[0].constant >> ((byte)VVar16.constant & 0x3f));
    break;
  default:
    return 3;
  }
  *(ExpressionValueType **)VStack_138.expression = pEVar13;
  return 0;
}

Assistant:

ASMJIT_API Error CodeHolder::bindLabel(const Label& label, uint32_t toSectionId, uint64_t toOffset) noexcept {
  LabelEntry* le = labelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (ASMJIT_UNLIKELY(toSectionId > _sections.size()))
    return DebugUtils::errored(kErrorInvalidSection);

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return DebugUtils::errored(kErrorLabelAlreadyBound);

  // Bind the label.
  Section* section = _sections[toSectionId];
  le->_section = section;
  le->_offset = toOffset;

  Error err = kErrorOk;
  CodeBuffer& buf = section->buffer();

  // Fix all links to this label we have collected so far if they are within
  // the same section. We ignore any inter-section links as these have to be
  // fixed later.
  LabelLinkIterator link(le);
  while (link) {
    uint32_t linkSectionId = link->sectionId;
    size_t linkOffset = link->offset;

    uint32_t relocId = link->relocId;
    if (relocId != Globals::kInvalidId) {
      // Adjust relocation data only.
      RelocEntry* re = _relocations[relocId];
      re->_payload += toOffset;
      re->_targetSectionId = toSectionId;
    }
    else {
      if (linkSectionId != toSectionId) {
        link.next();
        continue;
      }

      ASMJIT_ASSERT(linkOffset < buf.size());
      int64_t displacement = int64_t(toOffset - uint64_t(linkOffset) + uint64_t(int64_t(link->rel)));

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.regionSize());

      // Overwrite a real displacement in the CodeBuffer.
      if (!CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
        err = DebugUtils::errored(kErrorInvalidDisplacement);
        link.next();
        continue;
      }
    }

    link.resolveAndNext(this);
  }

  return err;
}